

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilities.hpp
# Opt level: O1

Vartype cimod::ToCimodVartype(string *vartype_str)

{
  int iVar1;
  Vartype VVar2;
  runtime_error *this;
  
  iVar1 = std::__cxx11::string::compare((char *)vartype_str);
  if (iVar1 == 0) {
    VVar2 = SPIN;
  }
  else {
    iVar1 = std::__cxx11::string::compare((char *)vartype_str);
    VVar2 = BINARY;
    if (iVar1 != 0) {
      this = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this,"Unknown vartype detected");
      __cxa_throw(this,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
  }
  return VVar2;
}

Assistant:

cimod::Vartype ToCimodVartype( const std::string &vartype_str ) {
    if ( vartype_str == "SPIN" ) {
      return Vartype::SPIN;
    } else if ( vartype_str == "BINARY" ) {
      return Vartype::BINARY;
    } else {
      throw std::runtime_error( "Unknown vartype detected" );
    }
  }